

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O2

void __thiscall MixSegmentTest_Test1_Test::TestBody(MixSegmentTest_Test1_Test *this)

{
  pointer pbVar1;
  pointer pbVar2;
  char *pcVar3;
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  AssertHelper local_1c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8 [4];
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string expected;
  string sentence;
  string actual;
  MixSegment segment;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sentence,"../dict/jieba.dict.utf8",(allocator<char> *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&actual,"../dict/hmm_model.utf8",(allocator<char> *)local_1b8);
  pcVar3 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expected,"",(allocator<char> *)&words);
  cppjieba::MixSegment::MixSegment(&segment,&sentence,&actual,&expected);
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::string::~string((string *)&actual);
  std::__cxx11::string::~string((string *)&sentence);
  sentence._M_dataplus._M_p = (pointer)&sentence.field_2;
  sentence._M_string_length = 0;
  sentence.field_2._M_local_buf[0] = '\0';
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  actual._M_dataplus._M_p = (pointer)&actual.field_2;
  actual._M_string_length = 0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  actual.field_2._M_local_buf[0] = '\0';
  expected._M_dataplus._M_p = (pointer)&expected.field_2;
  expected._M_string_length = 0;
  expected.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&sentence);
  std::__cxx11::string::assign((char *)&expected);
  cppjieba::MixSegment::Cut(&segment,&sentence,&words);
  pbVar2 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"/",(allocator<char> *)&local_1c0);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)&gtest_ar,(limonp *)pbVar1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8
             ,in_R8);
  std::__cxx11::string::operator=((string *)&actual,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_1b8);
  pbVar4 = &expected;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"actual","expected",&actual,pbVar4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_1b8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
               ,0x17,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::__cxx11::string::assign((char *)&sentence);
    std::__cxx11::string::assign((char *)&expected);
    cppjieba::MixSegment::Cut(&segment,&sentence,&words);
    pbVar2 = words.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar1 = words.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,"/",(allocator<char> *)&local_1c0);
    limonp::
    Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((string *)&gtest_ar,(limonp *)pbVar1,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1b8,pbVar4);
    std::__cxx11::string::operator=((string *)&actual,(string *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    std::__cxx11::string::~string((string *)local_1b8);
    pbVar4 = &expected;
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar,"actual","expected",&actual,pbVar4);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)local_1b8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                 ,0x1f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b8);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::__cxx11::string::assign((char *)&sentence);
      std::__cxx11::string::assign((char *)&expected);
      cppjieba::MixSegment::Cut(&segment,&sentence,&words,false);
      pbVar2 = words.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar1 = words.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b8,"/",(allocator<char> *)&local_1c0);
      limonp::
      Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((string *)&gtest_ar,(limonp *)pbVar1,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1b8,pbVar4);
      std::__cxx11::string::operator=((string *)&actual,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
      std::__cxx11::string::~string((string *)local_1b8);
      pbVar4 = &expected;
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar,"actual","expected",&actual,pbVar4);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        std::__cxx11::string::assign((char *)&sentence);
        std::__cxx11::string::assign((char *)&expected);
        cppjieba::MixSegment::Cut(&segment,&sentence,&words);
        pbVar2 = words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar1 = words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b8,"/",(allocator<char> *)&local_1c0);
        limonp::
        Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((string *)&gtest_ar,(limonp *)pbVar1,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b8,pbVar4);
        std::__cxx11::string::operator=((string *)&actual,(string *)&gtest_ar);
        std::__cxx11::string::~string((string *)&gtest_ar);
        std::__cxx11::string::~string((string *)local_1b8);
        testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                  ((internal *)&gtest_ar,"actual","expected",&actual,&expected);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)local_1b8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                     ,0x2f,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b8);
          testing::internal::AssertHelper::~AssertHelper(&local_1c0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(local_1b8);
        }
        goto LAB_001546c2;
      }
      testing::Message::Message((Message *)local_1b8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                 ,0x27,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b8);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_1c0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_1b8);
LAB_001546c2:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::string::~string((string *)&actual);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&words);
  std::__cxx11::string::~string((string *)&sentence);
  cppjieba::MixSegment::~MixSegment(&segment);
  return;
}

Assistant:

TEST(MixSegmentTest, Test1) {
  MixSegment segment("../dict/jieba.dict.utf8", "../dict/hmm_model.utf8");;
  string sentence;
  vector<string> words;
  string actual;
  string expected;

  {
    sentence = "我来自北京邮电大学。。。学号123456，用AK47";
    expected = "我/来自/北京邮电大学/。/。/。/学号/123456/，/用/AK47";
    segment.Cut(sentence, words);
    actual = Join(words.begin(), words.end(), "/");
    ASSERT_EQ(actual, expected);
  }

  {
    sentence = "B超 T恤";
    expected = "B超/ /T恤";
    segment.Cut(sentence, words);
    actual = Join(words.begin(), words.end(), "/");
    ASSERT_EQ(actual, expected);
  }

  {
    sentence = "他来到了网易杭研大厦";
    expected = "他/来到/了/网易/杭/研/大厦";
    segment.Cut(sentence, words, false);
    actual = Join(words.begin(), words.end(), "/");
    ASSERT_EQ(actual, expected);
  }

  {
    sentence = "他来到了网易杭研大厦";
    expected = "他/来到/了/网易/杭研/大厦";
    segment.Cut(sentence, words);
    actual = Join(words.begin(), words.end(), "/");
    ASSERT_EQ(actual, expected);
  }
}